

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  GroupInfo *in_RSI;
  CumulativeReporterBase *in_RDI;
  Timer *in_stack_ffffffffffffff70;
  allocator *paVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  GroupInfo *local_10;
  
  local_10 = in_RSI;
  Timer::start(in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::__cxx11::ostringstream::str((string *)&in_RDI[1].m_testCases);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",paVar1);
  std::__cxx11::ostringstream::str((string *)&in_RDI[3].m_sections);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *(undefined4 *)
   &in_RDI[5].m_assertions.
    super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  CumulativeReporterBase::testGroupStarting(in_RDI,local_10);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) CATCH_OVERRIDE {
            suiteTimer.start();
            stdOutForSuite.str("");
            stdErrForSuite.str("");
            unexpectedExceptions = 0;
            CumulativeReporterBase::testGroupStarting( groupInfo );
        }